

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Fad<double> *pFVar4;
  double *pdVar5;
  FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *pFVar6;
  Fad<double> *pFVar7;
  double *pdVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>_>_>
  *pFVar13;
  
  pFVar13 = (fadexpr->fadexpr_).left_;
  pFVar6 = (pFVar13->fadexpr_).right_;
  pFVar7 = (((pFVar6->fadexpr_).left_)->fadexpr_).expr_;
  uVar9 = (pFVar7->dx_).num_elts;
  uVar1 = (((pFVar6->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 < (int)uVar9) {
    uVar1 = uVar9;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00e154c7;
    pdVar5 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
          pFVar13 = (fadexpr->fadexpr_).left_;
          pFVar6 = (pFVar13->fadexpr_).right_;
          pFVar7 = (((pFVar6->fadexpr_).left_)->fadexpr_).expr_;
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00e154c7;
    }
    if (uVar2 != 0) {
      pdVar5 = (this->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
        pFVar13 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar10 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar10 = (ulong)uVar1 << 3;
    }
    pdVar5 = (double *)operator_new__(uVar10);
    (this->dx_).ptr_to_data = pdVar5;
    pFVar6 = (pFVar13->fadexpr_).right_;
    pFVar7 = (((pFVar6->fadexpr_).left_)->fadexpr_).expr_;
    uVar9 = (pFVar7->dx_).num_elts;
  }
  if ((uVar9 == 0) || (pFVar4 = (pFVar6->fadexpr_).right_, (pFVar4->dx_).num_elts == 0)) {
    if (0 < (int)uVar1) {
      pFVar4 = (pFVar6->fadexpr_).right_;
      iVar3 = (pFVar4->dx_).num_elts;
      uVar10 = (ulong)uVar1;
      lVar11 = 0;
      do {
        pdVar12 = (double *)((long)(pFVar7->dx_).ptr_to_data + lVar11);
        if (uVar9 == 0) {
          pdVar12 = &pFVar7->defaultVal;
        }
        pdVar8 = (double *)((long)(pFVar4->dx_).ptr_to_data + lVar11);
        if (iVar3 == 0) {
          pdVar8 = &pFVar4->defaultVal;
        }
        *(double *)((long)pdVar5 + lVar11) =
             ((-*pdVar12 - *pdVar8) * (pFVar13->fadexpr_).left_.constant_) /
             (fadexpr->fadexpr_).right_.constant_;
        lVar11 = lVar11 + 8;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
  }
  else if (0 < (int)uVar1) {
    pdVar12 = (pFVar7->dx_).ptr_to_data;
    pdVar8 = (pFVar4->dx_).ptr_to_data;
    uVar10 = 0;
    do {
      pdVar5[uVar10] =
           ((-pdVar12[uVar10] - pdVar8[uVar10]) * (pFVar13->fadexpr_).left_.constant_) /
           (fadexpr->fadexpr_).right_.constant_;
      uVar10 = uVar10 + 1;
    } while (uVar1 != uVar10);
  }
LAB_00e154c7:
  this->val_ = ((-pFVar7->val_ - ((pFVar6->fadexpr_).right_)->val_) *
               (pFVar13->fadexpr_).left_.constant_) / (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}